

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataDeviceHandleDrop(void *userData,wl_data_device *device)

{
  char **paths_00;
  int local_34;
  int i;
  char **paths;
  char *pcStack_20;
  int count;
  char *string;
  wl_data_device *device_local;
  void *userData_local;
  
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    string = (char *)device;
    device_local = (wl_data_device *)userData;
    pcStack_20 = readDataOfferAsString(_glfw.wl.dragOffer,"text/uri-list");
    if (pcStack_20 != (char *)0x0) {
      paths_00 = _glfwParseUriList(pcStack_20,(int *)((long)&paths + 4));
      if (paths_00 != (char **)0x0) {
        _glfwInputDrop(_glfw.wl.dragFocus,paths._4_4_,paths_00);
      }
      for (local_34 = 0; local_34 < paths._4_4_; local_34 = local_34 + 1) {
        _glfw_free(paths_00[local_34]);
      }
      _glfw_free(paths_00);
    }
    _glfw_free(pcStack_20);
  }
  return;
}

Assistant:

static void dataDeviceHandleDrop(void* userData,
                                 struct wl_data_device* device)
{
    if (!_glfw.wl.dragOffer)
        return;

    char* string = readDataOfferAsString(_glfw.wl.dragOffer, "text/uri-list");
    if (string)
    {
        int count;
        char** paths = _glfwParseUriList(string, &count);
        if (paths)
            _glfwInputDrop(_glfw.wl.dragFocus, count, (const char**) paths);

        for (int i = 0; i < count; i++)
            _glfw_free(paths[i]);

        _glfw_free(paths);
    }

    _glfw_free(string);
}